

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aln_filter.cpp
# Opt level: O2

alns_t * example::filter_to_unique_cds_for_gene
                   (alns_t *__return_storage_ptr__,alns_t *alns_for_gene)

{
  aln_t *paVar1;
  alns_t *paVar2;
  bool bVar3;
  aln_t *paVar4;
  long lVar5;
  const_iterator __first;
  aln_t *paVar6;
  long lVar7;
  aln_t *extraout_RDX;
  aln_t *_;
  aln_t *extraout_RDX_00;
  _Head_base<2UL,_long_&,_false> _Var8;
  const_iterator cVar9;
  const_iterator __position;
  pointer paVar10;
  pointer paVar11;
  __normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
  __last;
  __normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
  __seed;
  value_type *__v;
  size_type *__v_00;
  undefined1 local_1a9;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
  local_1a8;
  undefined1 local_188 [16];
  pointer local_178;
  concat local_169;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_168;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_148;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_128;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_108;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  *local_f0;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_e8;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_c8;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_a8;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_88;
  alns_t *local_70;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_68;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_48;
  
  paVar10 = (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
            _M_impl.super__Vector_impl_data._M_start;
  cVar9._M_current =
       (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  lVar7 = (long)cVar9._M_current - (long)paVar10;
  paVar4 = paVar10 + 2;
  for (lVar5 = lVar7 >> 9; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (paVar4[-2].chr_cds_start_pos == 0) {
      __first._M_current = paVar4 + -2;
      goto LAB_0011108d;
    }
    if (paVar4[-1].chr_cds_start_pos == 0) {
      __first._M_current = paVar4 + -1;
      goto LAB_0011108d;
    }
    __first._M_current = paVar4;
    if (paVar4->chr_cds_start_pos == 0) goto LAB_0011108d;
    if (paVar4[1].chr_cds_start_pos == 0) {
      __first._M_current = paVar4 + 1;
      goto LAB_0011108d;
    }
    paVar4 = paVar4 + 4;
    lVar7 = lVar7 + -0x200;
  }
  lVar7 = lVar7 >> 7;
  paVar6 = paVar4 + -2;
  if (lVar7 == 1) {
LAB_001118b6:
    __first._M_current = paVar6;
    if (paVar6->chr_cds_start_pos != 0) {
      __first._M_current = cVar9._M_current;
    }
  }
  else if (lVar7 == 3) {
    __first._M_current = paVar6;
    if (paVar4[-2].chr_cds_start_pos != 0) {
      paVar6 = paVar4 + -1;
      goto LAB_001118a7;
    }
  }
  else {
    __first._M_current = cVar9._M_current;
    if (lVar7 != 2) goto LAB_001110d1;
LAB_001118a7:
    __first._M_current = paVar6;
    if (paVar6->chr_cds_start_pos != 0) {
      paVar6 = paVar6 + 1;
      goto LAB_001118b6;
    }
  }
LAB_0011108d:
  paVar4 = __first._M_current;
  if (__first._M_current != cVar9._M_current) {
    while (paVar6 = __first._M_current + 1, paVar6 != cVar9._M_current) {
      paVar1 = __first._M_current + 1;
      __first._M_current = paVar6;
      if (paVar1->chr_cds_start_pos != 0) {
        aln_t::operator=(paVar4,paVar6);
        paVar4 = paVar4 + 1;
      }
    }
    cVar9._M_current =
         (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    __first._M_current = paVar4;
  }
LAB_001110d1:
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::erase(alns_for_gene,__first,cVar9);
  __seed._M_current =
       (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_178 = (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar10 = local_178;
  if (__seed._M_current != __last._M_current) {
    local_188._0_8_ = __seed._M_current;
    local_188._8_8_ = __last._M_current;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::_Temporary_buffer(&local_1a8,__seed,
                        (((long)__last._M_current - (long)__seed._M_current >> 7) + 1) / 2);
    if (local_1a8._M_buffer == (aln_t *)0x0) {
      std::operator()(__seed,__last,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )0x0);
    }
    else {
      std::operator()(__seed,__last,local_1a8._M_buffer,local_1a8._M_len,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_148);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::~_Temporary_buffer(&local_1a8);
    paVar10 = local_178;
    __last._M_current = (aln_t *)local_188._8_8_;
    __seed._M_current = (aln_t *)local_188._0_8_;
  }
  local_188._0_8_ = (long *)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_188);
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = __seed._M_current;
  local_188._8_8_ = __last._M_current;
  local_178 = paVar10;
  if (__seed._M_current != __last._M_current) {
    local_1a8._M_original_len = 0;
    local_1a8._M_len = 0;
    local_1a8._M_buffer = (aln_t *)0x0;
    std::
    vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
    ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
              ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                *)&local_128,(vector<example::aln_t,_std::allocator<example::aln_t>_> *)&local_1a8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
              ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)&local_1a8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
              (local_128.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,
               local_128.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_finish,__seed._M_current);
    while (__v = __seed._M_current + 1, __v != __last._M_current) {
      cVar9._M_current =
           local_128.
           super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (cVar9._M_current[-1].chr_cds_start_pos != __seed._M_current[1].chr_cds_start_pos) {
        local_1a8._M_original_len = 0;
        local_1a8._M_len = 0;
        local_1a8._M_buffer = (aln_t *)0x0;
        std::
        vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
        ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
                  ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                    *)&local_128,
                   (vector<example::aln_t,_std::allocator<example::aln_t>_> *)&local_1a8);
        std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
                  ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)&local_1a8);
        cVar9._M_current =
             local_128.
             super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
                (local_128.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,cVar9,__v);
      __seed._M_current = __v;
    }
  }
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_188);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_108);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_168);
  local_178 = (pointer)local_128.
                       super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  paVar10 = (pointer)local_128.
                     super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
  _Var8._M_head_impl =
       (long *)local_128.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = _Var8._M_head_impl;
  local_188._8_8_ = paVar10;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar11 = local_178;
  if ((pointer)_Var8._M_head_impl != paVar10) {
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                         *)&local_1a8,
                        (__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                         )_Var8._M_head_impl,
                        (((long)paVar10 - (long)_Var8._M_head_impl) / 0x18 + 1) / 2);
    if (local_1a8._M_buffer == (aln_t *)0x0) {
      std::operator()((__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )_Var8._M_head_impl,
                      (__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )paVar10,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )0x0);
    }
    else {
      std::operator()((__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )_Var8._M_head_impl,
                      (__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )paVar10,
                      (vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8._M_buffer
                      ,local_1a8._M_len,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_88);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                *)&local_1a8);
    paVar11 = local_178;
    paVar10 = (pointer)local_188._8_8_;
    _Var8._M_head_impl = (long *)local_188._0_8_;
  }
  local_188._0_8_ = (long *)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)local_188);
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = _Var8._M_head_impl;
  local_188._8_8_ = paVar10;
  local_178 = paVar11;
  if ((pointer)_Var8._M_head_impl != paVar10) {
    local_1a8._M_original_len = 0;
    local_1a8._M_len = 0;
    local_1a8._M_buffer = (aln_t *)0x0;
    std::
    vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
    ::
    emplace_back<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
              ((vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
                *)&local_168,
               (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                *)&local_1a8);
    std::
    vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
    ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               *)&local_1a8);
    std::
    vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
    ::_M_insert_rval((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                      *)&local_168.
                         super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl
                         .super__Vector_impl_data._M_finish[-1].chr_stop,
                     (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
                     local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].chr_cds_start_pos,
                     (value_type *)_Var8._M_head_impl);
    while (__v_00 = &(((pointer)_Var8._M_head_impl)->mrna_id).first._M_string_length,
          (pointer)__v_00 != paVar10) {
      __position._M_current =
           (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
           local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].chr_cds_start_pos;
      if ((((pointer)_Var8._M_head_impl)->mrna_id).first.field_2._M_allocated_capacity - *__v_00 !=
          (long)__position._M_current[-1].
                super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)__position._M_current[-1].
                super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                super__Vector_impl_data._M_start) {
        local_1a8._M_original_len = 0;
        local_1a8._M_len = 0;
        local_1a8._M_buffer = (aln_t *)0x0;
        std::
        vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
        ::
        emplace_back<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
                  ((vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
                    *)&local_168,
                   (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                    *)&local_1a8);
        std::
        vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
        ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                   *)&local_1a8);
        __position._M_current =
             (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
             local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].chr_cds_start_pos;
      }
      std::
      vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
      ::_M_insert_rval((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                        *)&local_168.
                           super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish[-1].chr_stop,__position,
                       (value_type *)__v_00);
      _Var8._M_head_impl = (long *)__v_00;
    }
  }
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)local_188);
  local_1a8._M_original_len = 1;
  local_1a8._M_len = 0;
  rangeless::fn::operators::operator%
            ((vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
              *)&local_108,
             (vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
              *)&local_168,(take_while<rangeless::fn::impl::call_count_lt> *)&local_1a8);
  rangeless::fn::operators::operator%
            (&local_48,
             (vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
              *)&local_108,(concat *)local_188);
  local_70 = __return_storage_ptr__;
  std::
  vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
             *)&local_108);
  std::
  vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
             *)&local_168);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_148);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)&local_e8);
  local_f0 = &local_48;
  rangeless::fn::operators::operator%(&local_c8,local_f0,&local_169);
  local_178 = local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  paVar10 = local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
            super__Vector_impl_data._M_finish;
  _Var8._M_head_impl =
       &(local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
         super__Vector_impl_data._M_start)->aln_id;
  local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = _Var8._M_head_impl;
  local_188._8_8_ = paVar10;
  local_88.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar11 = local_178;
  if ((pointer)_Var8._M_head_impl != paVar10) {
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::_Temporary_buffer(&local_1a8,
                        (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                         )_Var8._M_head_impl,
                        (((long)paVar10 - (long)_Var8._M_head_impl >> 7) + 1) / 2);
    if (local_1a8._M_buffer == (aln_t *)0x0) {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )_Var8._M_head_impl,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar10,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_1a9);
    }
    else {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )_Var8._M_head_impl,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar10,local_1a8._M_buffer,local_1a8._M_len,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_1a9);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::~_Temporary_buffer(&local_1a8);
    _Var8._M_head_impl = (long *)local_188._0_8_;
    paVar11 = local_178;
    paVar10 = (pointer)local_188._8_8_;
  }
  local_188._0_8_ = (long *)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_188);
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)_Var8._M_head_impl;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = paVar10;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = paVar11;
  if ((pointer)_Var8._M_head_impl != paVar10) {
    local_1a8._M_original_len = 0;
    local_1a8._M_len = 0;
    local_1a8._M_buffer = (aln_t *)0x0;
    std::
    vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
    ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
              ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                *)&local_148,(vector<example::aln_t,_std::allocator<example::aln_t>_> *)&local_1a8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
              ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)&local_1a8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
              (local_148.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,
               local_148.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_finish,(value_type *)_Var8._M_head_impl);
    paVar4 = extraout_RDX;
    while (_Var8._M_head_impl = _Var8._M_head_impl + 0x80, (pointer)_Var8._M_head_impl != paVar10) {
      filter_to_unique_cds_for_gene(std::vector<example::aln_t,std::allocator<example::aln_t>>)::$_2
      ::operator()((tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>
                    *)&local_1a8,
                   (__2 *)(local_148.
                           super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish + -1),paVar4);
      filter_to_unique_cds_for_gene(std::vector<example::aln_t,std::allocator<example::aln_t>>)::$_2
      ::operator()((tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>
                    *)local_188,(__2 *)_Var8._M_head_impl,_);
      bVar3 = std::
              __tuple_compare<std::tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>,_std::tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>,_0UL,_3UL>
              ::__eq((tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>
                      *)&local_1a8,
                     (tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>
                      *)local_188);
      if (!bVar3) {
        local_1a8._M_original_len = 0;
        local_1a8._M_len = 0;
        local_1a8._M_buffer = (aln_t *)0x0;
        std::
        vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
        ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
                  ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                    *)&local_148,
                   (vector<example::aln_t,_std::allocator<example::aln_t>_> *)&local_1a8);
        std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
                  ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)&local_1a8);
      }
      std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
                (local_148.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,
                 local_148.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                 super__Vector_impl_data._M_finish,(value_type *)_Var8._M_head_impl);
      paVar4 = extraout_RDX_00;
    }
  }
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_108);
  local_1a8._M_original_len = 1;
  local_1a8._M_len = 0;
  rangeless::fn::operators::operator%
            ((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
              *)&local_168,&local_148,(take_while<rangeless::fn::impl::call_count_lt> *)&local_1a8);
  rangeless::fn::operators::operator%
            (&local_a8,
             (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
              *)&local_168,(concat *)local_188);
  paVar2 = local_70;
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)&local_168);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_148);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_e8);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_88);
  local_178 = local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  paVar11 = local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
            super__Vector_impl_data._M_finish;
  paVar10 = local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_188._0_8_ =
       local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_188._8_8_ =
       local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (paVar10 != paVar11) {
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::_Temporary_buffer(&local_1a8,
                        (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                         )paVar10,(((long)paVar11 - (long)paVar10 >> 7) + 1) / 2);
    if (local_1a8._M_buffer == (aln_t *)0x0) {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar10,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar11,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_108);
    }
    else {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar10,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar11,local_1a8._M_buffer,local_1a8._M_len,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_108);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::~_Temporary_buffer(&local_1a8);
  }
  (paVar2->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_188._0_8_;
  (paVar2->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_188._8_8_;
  (paVar2->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_178;
  local_188._0_8_ = (long *)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_188);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_a8);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_c8);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_128);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_68);
  return paVar2;
}

Assistant:

static auto filter_to_unique_cds_for_gene(alns_t alns_for_gene) -> alns_t
{
    return std::move(alns_for_gene)

    // (5.1) Keep alignments with valid cds-start.

  % fn::where L( _.chr_cds_start_pos != aln_t::invalid_pos )

    //-------------------------------------------------------------------
    // (5.2) Keep alignments with most-ubiquitous valid cds-starts.

  % my::group_all_by L( _.chr_cds_start_pos )
  % my::where_max_by L( _.size() )
  % fn::concat()

    //-------------------------------------------------------------------
    // Filter to unique chr_cds_start_pos.
    // (5.3) Prefer on "NC_*" chr-accession,
    // (5.4) then lower chr-id, 
    // (5.5) then more upstream cds-start.

  % my::where_min_by L( fn::tie_lvals( _.chr_id.first.find("NC_") != 0, 
                                       _.chr_id, 
                                       _.chr_cds_start_pos))

#if 1
    //-------------------------------------------------------------------
    // (6) Sort by decreasing alignment score, then by increasing mrna-id.

  % fn::sort_by L( fn::tie_lvals( fn::by::decreasing( _.score), _.mrna_id))

#else // alternatively, e.g if you want to use your own sort

  % [](alns_t alns)
    {
        gfx::timsort(
            alns.begin(), alns.end(), 
            fn::by::make_comp([](const aln_t& a)
            {
                return std::make_pair(
                   fn::by::decreasing( a.score),
                            std::cref( a.mrna_id));
            });
        return std::move(alns);
    }
#endif
    ; // end of return-statement
}